

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O1

bool cmAddSubDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  string *psVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string *psVar10;
  int iVar11;
  bool bVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string srcPath;
  string binPath;
  string binArg;
  string error;
  byte local_168;
  bool local_164;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_c0;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 local_90;
  char *local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  char *local_68;
  cmExecutionStatus *local_60;
  string *local_58;
  string local_50;
  
  psVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 == psVar7) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  this = status->Makefile;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  psVar10 = psVar6 + 1;
  bVar12 = psVar10 == psVar7;
  if (bVar12) {
    local_168 = 0;
    local_164 = false;
  }
  else {
    local_58 = (string *)&status->Error;
    local_164 = false;
    local_168 = 0;
    local_60 = status;
    do {
      iVar5 = std::__cxx11::string::compare((char *)psVar10);
      iVar11 = 3;
      if (iVar5 == 0) {
        local_164 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar10);
        if (iVar5 == 0) {
          local_168 = 1;
        }
        else if (local_110._M_string_length == 0) {
          iVar11 = 0;
          std::__cxx11::string::_M_assign((string *)&local_110);
        }
        else {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"called with incorrect number of arguments","");
          std::__cxx11::string::_M_assign(local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          iVar11 = 1;
        }
      }
      status = local_60;
      if ((iVar11 != 3) && (iVar11 != 0)) break;
      psVar10 = psVar10 + 1;
      bVar12 = psVar10 == psVar7;
    } while (!bVar12);
  }
  if (!bVar12) {
    bVar12 = false;
    goto LAB_0032e846;
  }
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"SYSTEM","");
  bVar4 = cmMakefile::GetPropertyAsBool(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  bVar12 = cmsys::SystemTools::FileIsFullPath(psVar6);
  if (bVar12) {
    std::__cxx11::string::_M_assign((string *)&local_150);
  }
  else {
    psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    local_c0._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
    local_c0._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
    local_f0._M_string_length = (size_type)&local_f0.field_2;
    local_f0._M_dataplus._M_p = &DAT_00000001;
    local_f0.field_2._M_local_buf[0] = '/';
    local_c0.field_2._M_allocated_capacity = 1;
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(psVar6->_M_dataplus)._M_p;
    local_a0 = psVar6->_M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)&local_c0;
    local_c0.field_2._8_8_ = local_f0._M_string_length;
    cmCatViews_abi_cxx11_(&local_130,views);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar12 = cmsys::SystemTools::FileIsDirectory(&local_150);
  if (bVar12) {
    psVar6 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this);
    cmsys::SystemTools::CollapseFullPath(&local_c0,&local_150,psVar6);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    if (local_110._M_string_length == 0) {
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      bVar12 = cmsys::SystemTools::IsSubDirectory(&local_150,psVar6);
      if (bVar12) {
        psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
        psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        sVar2 = psVar6->_M_string_length;
        sVar3 = psVar7->_M_string_length;
        if (sVar2 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = sVar2 - ((psVar6->_M_dataplus)._M_p[sVar2 - 1] == '/');
        }
        if (sVar3 == 0) {
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        }
        else {
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(sVar3 - ((psVar7->_M_dataplus)._M_p[sVar3 - 1] == '/'));
        }
        if (local_150._M_string_length < uVar8) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
        }
        local_c0._M_dataplus._M_p = (pointer)paVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7->_M_string_length < paVar9) {
          local_c0._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
        }
        local_c0._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
        local_c0.field_2._8_8_ = local_150._M_dataplus._M_p + uVar8;
        views_03._M_len = 2;
        views_03._M_array = (iterator)&local_c0;
        local_c0.field_2._M_allocated_capacity = local_150._M_string_length - uVar8;
        cmCatViews_abi_cxx11_(&local_f0,views_03);
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          local_50.field_2._M_allocated_capacity =
               CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                        local_f0.field_2._M_local_buf[0]);
          local_50._M_dataplus._M_p = local_f0._M_dataplus._M_p;
          goto LAB_0032e797;
        }
        goto LAB_0032e79f;
      }
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      local_c0._M_dataplus._M_p = (pointer)0x32;
      local_c0._M_string_length = 0x77bba8;
      local_c0.field_2._M_allocated_capacity = 0xb;
      local_c0.field_2._8_8_ = (long)"GHS_TOOLSET_ROOT directory \"" + 0x11;
      local_a0 = local_150._M_string_length;
      local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_150._M_dataplus._M_p;
      local_90 = 0x1c;
      local_88 = "\" is not a subdirectory of \"";
      local_78 = (psVar6->_M_dataplus)._M_p;
      local_80 = psVar6->_M_string_length;
      local_70 = 0x5a;
      local_68 = 
      "\".  When specifying an out-of-tree source a binary directory must be explicitly specified.";
      views_02._M_len = 6;
      views_02._M_array = (iterator)&local_c0;
      cmCatViews_abi_cxx11_(&local_f0,views_02);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
      }
      bVar12 = false;
    }
    else {
      bVar12 = cmsys::SystemTools::FileIsFullPath(&local_110);
      if (bVar12) {
        std::__cxx11::string::_M_assign((string *)&local_130);
      }
      else {
        psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_c0._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
        local_c0._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
        local_f0._M_string_length = (size_type)&local_f0.field_2;
        local_f0._M_dataplus._M_p = &DAT_00000001;
        local_f0.field_2._M_local_buf[0] = '/';
        local_c0.field_2._M_allocated_capacity = 1;
        local_a0 = local_110._M_string_length;
        local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_110._M_dataplus._M_p;
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_c0;
        local_c0.field_2._8_8_ = local_f0._M_string_length;
        cmCatViews_abi_cxx11_(&local_50,views_01);
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0032e797:
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0032e79f:
      cmsys::SystemTools::CollapseFullPath(&local_c0,&local_130);
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      bVar12 = true;
      cmMakefile::AddSubDirectory
                (this,&local_150,&local_130,local_164,true,(bool)(bVar4 | local_168));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_c0.field_2._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_c0.field_2._M_allocated_capacity = psVar6->_M_string_length;
    local_c0._M_dataplus._M_p = (pointer)0xe;
    local_c0._M_string_length = 0x77bb73;
    local_a0 = 0x25;
    local_98 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x77bb82;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_c0;
    cmCatViews_abi_cxx11_(&local_f0,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
    bVar12 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
LAB_0032e846:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  return bVar12;
}

Assistant:

bool cmAddSubDirectoryCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;
  bool system = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (arg == "SYSTEM") {
      system = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      status.SetError("called with incorrect number of arguments");
      return false;
    }
  }
  // "SYSTEM" directory property should also affects targets in nested
  // subdirectories.
  if (mf.GetPropertyAsBool("SYSTEM")) {
    system = true;
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = cmStrCat(mf.GetCurrentSourceDirectory(), '/', srcArg);
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = cmStrCat("given source \"", srcArg,
                                 "\" which is not an existing directory.");
    status.SetError(error);
    return false;
  }
  srcPath =
    cmSystemTools::CollapseFullPath(srcPath, mf.GetHomeOutputDirectory());

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(srcPath,
                                       mf.GetCurrentSourceDirectory())) {
      status.SetError(
        cmStrCat("not given a binary directory but the given source ",
                 "directory \"", srcPath, "\" is not a subdirectory of \"",
                 mf.GetCurrentSourceDirectory(),
                 "\".  When specifying an "
                 "out-of-tree source a binary directory must be explicitly "
                 "specified."));
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = mf.GetCurrentSourceDirectory();
    const std::string& bin = mf.GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = cmStrCat(cm::string_view(bin).substr(0, binLen),
                       cm::string_view(srcPath).substr(srcLen));
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', binArg);
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  mf.AddSubDirectory(srcPath, binPath, excludeFromAll, true, system);

  return true;
}